

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O3

bool __thiscall LinearNE<0,_1,_0>::propagate(LinearNE<0,_1,_0> *this)

{
  ulong uVar1;
  long lVar2;
  long *plVar3;
  bool bVar4;
  char cVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  anon_union_8_2_743a5d44_for_Reason_0 aVar13;
  long lVar14;
  Clause *c;
  anon_union_8_2_743a5d44_for_Reason_0 local_38;
  
  if ((this->num_unfixed).v == 0) {
    if ((this->sum_fixed).v != 0) {
      return true;
    }
    if (so.lazy) {
      iVar7 = this->sz;
      local_38._pt = (Clause *)malloc((long)iVar7 * 4 + 0xc);
      *(uint *)local_38._pt = (iVar7 + 1) * 0x100 | 2;
      vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_38._pt);
      aVar13 = local_38;
      if (0 < this->sz) {
        lVar11 = 0;
        uVar12 = 1;
        do {
          iVar7 = (**(code **)(**(long **)((long)&this->x->var + lVar11) + 0x50))();
          if (*(uint *)aVar13._pt >> 8 <= uVar12) goto LAB_001a8220;
          (aVar13._pt)->data[uVar12].x = iVar7;
          lVar11 = lVar11 + 0x10;
          bVar4 = (long)uVar12 < (long)this->sz;
          uVar12 = uVar12 + 1;
        } while (bVar4);
      }
    }
    else {
      aVar13._pt = (Clause *)0x0;
    }
    SAT::cEnqueue(&sat,(Lit)(((this->r).s ^ 1) + (this->r).v * 2),(Reason)aVar13);
    return sat.confl == (Clause *)0x0;
  }
  uVar12 = 0;
  lVar11 = 0;
  do {
    lVar10 = lVar11;
    lVar14 = *(long *)((long)&this->x->var + lVar10);
    lVar11 = lVar10 + 0x10;
    uVar12 = uVar12 - 1;
  } while (*(int *)(lVar14 + 0xc) == *(int *)(lVar14 + 0x10));
  iVar7 = this->sz;
  iVar9 = (int)~uVar12;
  if (iVar9 < *(int *)&(this->super_Propagator).field_0x14) {
    lVar2 = -(this->sum_fixed).v;
    if (*(int *)(lVar14 + 0x10) < lVar2 || lVar2 < *(int *)(lVar14 + 0xc)) {
      return true;
    }
    if (*(long *)(lVar14 + 0x28) == 0) goto LAB_001a80a9;
    cVar5 = *(char *)(*(long *)(lVar14 + 0x28) + lVar2);
  }
  else {
    lVar14 = (this->sum_fixed).v;
    lVar2 = *(long *)((long)&this->y->var + lVar10);
    if (lVar14 < *(int *)(lVar2 + 0xc)) {
      return true;
    }
    if (*(int *)(lVar2 + 0x10) < lVar14) {
      return true;
    }
    if (*(long *)(lVar2 + 0x28) == 0) goto LAB_001a80a9;
    cVar5 = *(char *)(*(long *)(lVar2 + 0x28) + lVar14);
  }
  if (cVar5 == '\0') {
    return true;
  }
LAB_001a80a9:
  if (so.lazy) {
    local_38._pt = (Clause *)malloc((long)iVar7 * 4 + 8);
    *(uint *)local_38._pt = iVar7 << 8 | 2;
    vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_38._pt);
    aVar13 = local_38;
    if (lVar11 != 0x10) {
      lVar14 = 0;
      uVar8 = 0;
      do {
        uVar6 = (**(code **)(**(long **)((long)&this->x->var + lVar14) + 0x50))();
        uVar1 = uVar8 + 1;
        if (*(uint *)aVar13._pt >> 8 <= uVar1) goto LAB_001a8220;
        ((uint *)(aVar13._a + 8))[uVar8] = uVar6;
        lVar14 = lVar14 + 0x10;
        uVar8 = uVar1;
      } while (~uVar12 != uVar1);
    }
    uVar12 = -uVar12;
    if ((int)uVar12 < this->sz) {
      do {
        iVar7 = (**(code **)(**(long **)((long)&this->x->var + lVar11) + 0x50))();
        if (*(uint *)aVar13._pt >> 8 <= uVar12) {
LAB_001a8220:
          abort();
        }
        (aVar13._pt)->data[uVar12].x = iVar7;
        uVar12 = uVar12 + 1;
        lVar11 = lVar11 + 0x10;
      } while ((int)uVar12 < this->sz);
    }
  }
  else {
    aVar13._pt = (Clause *)0x0;
  }
  if (iVar9 < *(int *)&(this->super_Propagator).field_0x14) {
    plVar3 = *(long **)((long)&this->x->var + lVar10);
    cVar5 = (**(code **)(*plVar3 + 0x88))(plVar3,-(this->sum_fixed).v,aVar13._pt,1);
    if (cVar5 == '\0') {
      return false;
    }
  }
  else {
    plVar3 = *(long **)((long)&this->y->var + lVar10);
    cVar5 = (**(code **)(*plVar3 + 0x88))(plVar3,(this->sum_fixed).v,aVar13._pt,1);
    if (cVar5 == '\0') {
      return false;
    }
  }
  return true;
}

Assistant:

bool propagate() override {
		if ((R != 0) && r.isFalse()) {
			return true;
		}

		assert(num_unfixed <= 1);

		if (num_unfixed == 0) {
			if (sum_fixed == 0) {
				Clause* m_r = nullptr;
				if (so.lazy) {
					m_r = Reason_new(sz + 1);
					for (int i = 0; i < sz; i++) {
						(*m_r)[i + 1] = x[i].getValLit();
					}
				}
				return r.setVal(false, m_r);
			}
			return true;
		}

		if ((R != 0) && !r.isTrue()) {
			return true;
		}

		assert(num_unfixed == 1);

		int k = 0;
		while (x[k].isFixed()) {
			k++;
		}
		assert(k < sz);
		for (int i = k + 1; i < sz; i++) {
			assert(x[i].isFixed());
		}

		if ((k < sp && x[k].remValNotR(-sum_fixed)) || (k >= sp && y[k].remValNotR(-sum_fixed))) {
			Clause* m_r = nullptr;
			if (so.lazy) {
				m_r = Reason_new(sz + R);
				for (int i = 0; i < k; i++) {
					(*m_r)[i + 1] = x[i].getValLit();
				}
				for (int i = k + 1; i < sz; i++) {
					(*m_r)[i] = x[i].getValLit();
				}
				if (R != 0) {
					(*m_r)[sz] = r.getValLit();
				}
			}
			if (k < sp) {
				if (!x[k].remVal(-sum_fixed, m_r)) {
					return false;
				}
			} else {
				if (!y[k].remVal(-sum_fixed, m_r)) {
					return false;
				}
			}
		}

		return true;
	}